

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  ZSTD_CDict *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  undefined8 uVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  ulong in_R11;
  ulong uVar25;
  U32 UVar26;
  uint uVar27;
  uint uVar28;
  uint local_a0 [4];
  BYTE *local_90;
  int local_84;
  ZSTD_sequencePosition *local_80;
  size_t local_78;
  ulong local_70;
  uint local_68;
  uint local_64;
  size_t local_60;
  size_t local_58;
  ulong local_50;
  ZSTD_Sequence *local_48;
  long local_40;
  BYTE *local_38;
  
  local_80 = seqPos;
  uVar23 = (ulong)seqPos->posInSequence;
  local_60 = blockSize;
  local_90 = (BYTE *)src;
  pZVar3 = cctx->cdict;
  if (pZVar3 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_58 = 0;
      goto LAB_0127264c;
    }
    pZVar3 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_58 = pZVar3->dictContentSize;
LAB_0127264c:
  UVar26 = seqPos->idx;
  uVar20 = seqPos->posInSequence + (int)blockSize;
  pZVar4 = (cctx->blockState).prevCBlock;
  local_a0[2] = pZVar4->rep[2];
  uVar5 = *(undefined8 *)pZVar4->rep;
  local_a0[0] = (uint)uVar5;
  local_a0[1] = (uint)((ulong)uVar5 >> 0x20);
  local_40 = (long)src + blockSize;
  local_38 = (BYTE *)((long)src + blockSize + -0x20);
  local_84 = 0;
  uVar27 = 0;
  local_78 = inSeqsSize;
  do {
    uVar10 = local_a0[1];
    if (uVar20 == 0) {
      uVar20 = 0;
      goto LAB_01272aa5;
    }
    uVar18 = (ulong)UVar26;
    if ((inSeqsSize <= uVar18) || (local_84 != 0)) goto LAB_01272aa5;
    uVar13 = inSeqs[uVar18].offset;
    uVar28 = inSeqs[uVar18].litLength;
    uVar9 = inSeqs[uVar18].matchLength;
    uVar18 = (ulong)uVar9;
    uVar19 = uVar28 + uVar9;
    uVar21 = (uint)uVar23;
    if (uVar20 < uVar19) {
      iVar22 = 7;
      uVar9 = uVar20 - uVar28;
      if (uVar28 <= uVar20 && uVar9 != 0) {
        local_70 = in_R11;
        uVar17 = uVar28 - uVar21;
        if (uVar28 < uVar21) {
          uVar17 = 0;
        }
        if (local_60 < uVar18) {
          uVar24 = (uVar20 - uVar21) - uVar17;
          uVar21 = (cctx->appliedParams).cParams.minMatch;
          if (uVar24 < uVar21) goto LAB_0127272b;
          uVar19 = uVar19 - uVar20;
          iVar22 = 0;
          uVar28 = uVar21 - uVar19;
          uVar9 = uVar27;
          if (uVar21 >= uVar19 && uVar28 != 0) {
            uVar9 = uVar28;
          }
          if (uVar21 < uVar19) {
            uVar28 = 0;
          }
          uVar20 = uVar20 - uVar28;
          bVar8 = true;
          local_84 = 1;
          uVar18 = (ulong)(uVar24 - uVar28);
        }
        else {
LAB_0127272b:
          iVar22 = 7;
          bVar8 = false;
          uVar20 = uVar28;
        }
        inSeqsSize = local_78;
        uVar25 = local_70;
        uVar27 = uVar9;
        if (bVar8) goto LAB_01272752;
      }
    }
    else {
      uVar17 = uVar28 - uVar21;
      if (uVar28 < uVar21) {
        uVar17 = 0;
      }
      iVar22 = uVar21 - uVar28;
      if (uVar21 < uVar28) {
        iVar22 = 0;
      }
      uVar18 = (ulong)(uVar9 - iVar22);
      uVar23 = 0;
      uVar25 = in_R11;
      uVar20 = uVar20 - uVar19;
LAB_01272752:
      if ((uVar17 == 0) || (uVar28 = 1, local_a0[0] != uVar13)) {
        if (local_a0[1] == uVar13) {
          iVar22 = 2;
        }
        else {
          if (local_a0[2] != uVar13) {
            uVar28 = uVar13 + 3;
            if ((uVar17 == 0) && (local_a0[0] - 1 == uVar13)) {
              uVar28 = 3;
            }
            goto LAB_0127278a;
          }
          iVar22 = 3;
        }
        uVar28 = iVar22 - (uint)(uVar17 == 0);
      }
LAB_0127278a:
      if (uVar28 < 4) {
        uVar10 = uVar28 - (uVar17 != 0);
        if (uVar10 != 0) {
          if (uVar10 == 3) {
            uVar13 = local_a0[0] - 1;
          }
          else {
            uVar13 = local_a0[uVar10];
          }
          puVar11 = local_a0 + 1;
          if (uVar10 == 1) {
            puVar11 = local_a0 + 2;
          }
          local_a0[2] = *puVar11;
          local_a0[1] = local_a0[0];
          local_a0[0] = uVar13;
        }
      }
      else {
        local_a0[1] = local_a0[0];
        local_a0[2] = uVar10;
        local_a0[0] = uVar28 - 3;
      }
      uVar10 = (uint)uVar18;
      if ((cctx->appliedParams).validateSequences != 0) {
        uVar12 = (ulong)(uVar17 + uVar10) + local_80->posInSrc;
        local_80->posInSrc = uVar12;
        uVar15 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
        uVar14 = local_58 + uVar12;
        if (uVar15 < uVar12) {
          uVar14 = uVar15;
        }
        in_R11 = 0xffffffffffffff95;
        if (((ulong)uVar28 <= uVar14 + 3) &&
           (in_R11 = 0,
           uVar10 < 4 - ((cctx->appliedParams).cParams.minMatch == 3 ||
                        (cctx->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0))) {
          in_R11 = 0xffffffffffffff95;
        }
        iVar22 = 1;
        inSeqsSize = local_78;
        if (0xffffffffffffff88 < in_R11) goto LAB_01272a90;
      }
      if ((ulong)(UVar26 - local_80->idx) < (cctx->seqStore).maxNbSeq) {
        local_68 = uVar27;
        local_64 = UVar26;
        if (local_38 < local_90 + uVar17) {
          local_70 = uVar25;
          local_50 = uVar23;
          local_48 = inSeqs;
          ZSTD_safecopyLiterals((cctx->seqStore).lit,local_90,local_90 + uVar17,local_38);
          uVar23 = local_50;
          inSeqs = local_48;
          uVar25 = local_70;
        }
        else {
          pBVar6 = (cctx->seqStore).lit;
          uVar5 = *(undefined8 *)(local_90 + 8);
          *(undefined8 *)pBVar6 = *(undefined8 *)local_90;
          *(undefined8 *)(pBVar6 + 8) = uVar5;
          if (0x10 < uVar17) {
            pBVar6 = (cctx->seqStore).lit;
            uVar5 = *(undefined8 *)(local_90 + 0x18);
            *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)(local_90 + 0x10);
            *(undefined8 *)(pBVar6 + 0x18) = uVar5;
            if (0x20 < uVar17) {
              lVar16 = 0;
              do {
                uVar5 = *(undefined8 *)(local_90 + lVar16 + 0x20 + 8);
                pBVar2 = pBVar6 + lVar16 + 0x20;
                *(undefined8 *)pBVar2 = *(undefined8 *)(local_90 + lVar16 + 0x20);
                *(undefined8 *)(pBVar2 + 8) = uVar5;
                uVar5 = *(undefined8 *)(local_90 + lVar16 + 0x30 + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(local_90 + lVar16 + 0x30);
                *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                lVar16 = lVar16 + 0x20;
              } while (pBVar2 + 0x20 < pBVar6 + uVar17);
            }
          }
        }
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar17;
        if (0xffff < uVar17) {
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar7 = (cctx->seqStore).sequences;
        psVar7->litLength = (U16)uVar17;
        psVar7->offBase = uVar28;
        if (0xffff < uVar18 - 3) {
          (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)psVar7 - (long)(cctx->seqStore).sequencesStart) >> 3);
        }
        psVar7->mlBase = (U16)(uVar18 - 3);
        local_90 = local_90 + (uVar10 + uVar17);
        UVar26 = local_64 + (local_84 == 0);
        (cctx->seqStore).sequences = psVar7 + 1;
        iVar22 = 0;
        inSeqsSize = local_78;
        in_R11 = uVar25;
        uVar27 = local_68;
      }
      else {
        in_R11 = 0xffffffffffffff95;
        iVar22 = 1;
        inSeqsSize = local_78;
      }
    }
LAB_01272a90:
  } while (iVar22 == 0);
  if (iVar22 == 7) {
LAB_01272aa5:
    local_80->idx = UVar26;
    local_80->posInSequence = uVar20;
    pZVar4 = (cctx->blockState).nextCBlock;
    pZVar4->rep[2] = local_a0[2];
    *(ulong *)pZVar4->rep = CONCAT44(local_a0[1],local_a0[0]);
    in_R11 = (ulong)uVar27;
    if (local_90 != (BYTE *)(local_40 - in_R11)) {
      uVar23 = (ulong)(uint)((int)(BYTE *)(local_40 - in_R11) - (int)local_90);
      switchD_00b1422a::default((cctx->seqStore).lit,local_90,uVar23);
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar23;
      local_80->posInSrc = local_80->posInSrc + uVar23;
    }
  }
  return in_R11;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, ZSTD_hasExtSeqProd(&cctx->appliedParams)),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}